

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  long *plVar1;
  
  plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cout,1);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cout,-1);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cout,0);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cout,0);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cout,1);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cout,-1);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
	float a = 1.0f;
	float b = -1.0f;
	float c = 0.5f;
	float d = -0.5f;
	float e = 1.5f;
	float f = -1.5;

	std::cout << static_cast<int>(a) << std::endl;
	std::cout << static_cast<int>(b) << std::endl;
	std::cout << static_cast<int>(c) << std::endl;
	std::cout << static_cast<int>(d) << std::endl;
	std::cout << static_cast<int>(e) << std::endl;
	std::cout << static_cast<int>(f) << std::endl;
}